

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O0

int c14nCommonTest(char *filename,int with_comments,int mode,char *subdir)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  uint local_444;
  char *pcStack_440;
  int ret;
  char *ns;
  char *xpath;
  char *result;
  int len;
  char *base;
  char prefix [500];
  char local_218 [8];
  char buf [500];
  char *subdir_local;
  int mode_local;
  int with_comments_local;
  char *filename_local;
  
  ns = (char *)0x0;
  pcStack_440 = (char *)0x0;
  unique0x100001e4 = subdir;
  pcVar2 = baseFilename(filename);
  sVar3 = strlen(pcVar2);
  iVar1 = (int)sVar3 + -4;
  memcpy(&base,pcVar2,(long)iVar1);
  prefix[(long)iVar1 + -8] = '\0';
  iVar1 = snprintf(local_218,499,"result/c14n/%s/%s",stack0xffffffffffffffe0,&base);
  if (0x1f2 < iVar1) {
    buf[0x1eb] = '\0';
  }
  pcVar2 = strdup(local_218);
  iVar1 = snprintf(local_218,499,"test/c14n/%s/%s.xpath",stack0xffffffffffffffe0,&base);
  if (0x1f2 < iVar1) {
    buf[0x1eb] = '\0';
  }
  iVar1 = checkTestFile(local_218);
  if (iVar1 != 0) {
    ns = strdup(local_218);
  }
  iVar1 = snprintf(local_218,499,"test/c14n/%s/%s.ns",stack0xffffffffffffffe0,&base);
  if (0x1f2 < iVar1) {
    buf[0x1eb] = '\0';
  }
  iVar1 = checkTestFile(local_218);
  if (iVar1 != 0) {
    pcStack_440 = strdup(local_218);
  }
  nb_tests = nb_tests + 1;
  iVar1 = c14nRunTest(filename,with_comments,mode,ns,pcStack_440,pcVar2);
  local_444 = (uint)(iVar1 < 0);
  if (pcVar2 != (char *)0x0) {
    free(pcVar2);
  }
  if (ns != (char *)0x0) {
    free(ns);
  }
  if (pcStack_440 != (char *)0x0) {
    free(pcStack_440);
  }
  return local_444;
}

Assistant:

static int
c14nCommonTest(const char *filename, int with_comments, int mode,
               const char *subdir) {
    char buf[500];
    char prefix[500];
    const char *base;
    int len;
    char *result = NULL;
    char *xpath = NULL;
    char *ns = NULL;
    int ret = 0;

    base = baseFilename(filename);
    len = strlen(base);
    len -= 4;
    memcpy(prefix, base, len);
    prefix[len] = 0;

    if (snprintf(buf, 499, "result/c14n/%s/%s", subdir, prefix) >= 499)
        buf[499] = 0;
    result = strdup(buf);
    if (snprintf(buf, 499, "test/c14n/%s/%s.xpath", subdir, prefix) >= 499)
        buf[499] = 0;
    if (checkTestFile(buf)) {
	xpath = strdup(buf);
    }
    if (snprintf(buf, 499, "test/c14n/%s/%s.ns", subdir, prefix) >= 499)
        buf[499] = 0;
    if (checkTestFile(buf)) {
	ns = strdup(buf);
    }

    nb_tests++;
    if (c14nRunTest(filename, with_comments, mode,
                    xpath, ns, result) < 0)
        ret = 1;

    if (result != NULL) free(result);
    if (xpath != NULL) free(xpath);
    if (ns != NULL) free(ns);
    return(ret);
}